

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_dec.c
# Opt level: O1

uint8_t * VP8DecompressAlphaRows(VP8Decoder *dec,VP8Io *io,int row,int num_rows)

{
  byte bVar1;
  int stride;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint8_t *puVar7;
  ALPHDecoder *pAVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  size_t __n;
  uint8_t *puVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  
  iVar6 = io->crop_bottom;
  if (iVar6 < num_rows + row || (num_rows < 1 || row < 0)) {
LAB_00130107:
    puVar7 = (uint8_t *)0x0;
  }
  else {
    stride = io->width;
    if (dec->is_alpha_decoded_ == 0) {
      if (dec->alph_dec_ == (ALPHDecoder *)0x0) {
        pAVar8 = (ALPHDecoder *)WebPSafeCalloc(1,0xd8);
        dec->alph_dec_ = pAVar8;
        if (pAVar8 != (ALPHDecoder *)0x0) {
          puVar7 = (uint8_t *)WebPSafeMalloc((long)io->crop_bottom * (long)io->width,1);
          dec->alpha_plane_mem_ = puVar7;
          if (puVar7 != (uint8_t *)0x0) {
            dec->alpha_plane_ = puVar7;
            dec->alpha_prev_line_ = (uint8_t *)0x0;
            pAVar8 = dec->alph_dec_;
            pbVar2 = dec->alpha_data_;
            uVar11 = dec->alpha_data_size_;
            VP8FiltersInit();
            pAVar8->output_ = puVar7;
            iVar4 = io->height;
            pAVar8->width_ = io->width;
            pAVar8->height_ = iVar4;
            uVar5 = 0;
            if (1 < uVar11) {
              bVar1 = *pbVar2;
              pAVar8->method_ = bVar1 & 3;
              pAVar8->filter_ = *pbVar2 >> 2 & WEBP_FILTER_GRADIENT;
              uVar9 = *pbVar2 >> 4 & 3;
              pAVar8->pre_processing_ = uVar9;
              if ((((byte)(bVar1 & 3) < 2) && ((byte)uVar9 < 2)) && (*pbVar2 < 0x40)) {
                uVar11 = uVar11 - 1;
                VP8InitIoInternal(&pAVar8->io_,0x209);
                WebPInitCustomIo((WebPDecParams *)0x0,&pAVar8->io_);
                (pAVar8->io_).opaque = pAVar8;
                iVar4 = io->height;
                (pAVar8->io_).width = io->width;
                (pAVar8->io_).height = iVar4;
                iVar4 = io->crop_left;
                iVar12 = io->crop_right;
                iVar3 = io->crop_top;
                (pAVar8->io_).use_cropping = io->use_cropping;
                (pAVar8->io_).crop_left = iVar4;
                (pAVar8->io_).crop_right = iVar12;
                (pAVar8->io_).crop_top = iVar3;
                (pAVar8->io_).crop_bottom = io->crop_bottom;
                if (pAVar8->method_ == 0) {
                  uVar5 = (uint)((ulong)((long)pAVar8->height_ * (long)pAVar8->width_) <= uVar11);
                }
                else {
                  uVar5 = VP8LDecodeAlphaHeader(pAVar8,pbVar2 + 1,uVar11);
                }
              }
            }
            if (uVar5 != 0) {
              if (dec->alph_dec_->pre_processing_ == 1) {
                num_rows = iVar6 - row;
              }
              else {
                dec->alpha_dithering_ = 0;
              }
              goto LAB_00130149;
            }
          }
LAB_00130493:
          WebPSafeFree(dec->alpha_plane_mem_);
          dec->alpha_plane_mem_ = (uint8_t *)0x0;
          dec->alpha_plane_ = (uint8_t *)0x0;
          ALPHDelete(dec->alph_dec_);
          dec->alph_dec_ = (ALPHDecoder *)0x0;
        }
        goto LAB_00130107;
      }
LAB_00130149:
      pAVar8 = dec->alph_dec_;
      iVar6 = (pAVar8->io_).crop_bottom;
      if (pAVar8->method_ == 0) {
        iVar4 = pAVar8->width_;
        __n = (size_t)iVar4;
        puVar7 = dec->alpha_prev_line_;
        puVar15 = dec->alpha_data_;
        puVar13 = dec->alpha_plane_;
        lVar10 = (long)(iVar4 * row);
        if (pAVar8->filter_ == WEBP_FILTER_NONE) {
          iVar4 = num_rows;
          if (0 < num_rows) {
            do {
              memcpy(puVar13 + lVar10,puVar15 + lVar10 + 1,__n);
              lVar10 = lVar10 + __n;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            puVar7 = puVar13 + (lVar10 - __n);
          }
        }
        else if (0 < num_rows) {
          puVar15 = puVar15 + lVar10 + 1;
          puVar13 = puVar13 + lVar10;
          iVar12 = num_rows;
          do {
            (*WebPUnfilters[pAVar8->filter_])(puVar7,puVar15,puVar13,iVar4);
            puVar14 = puVar13 + __n;
            puVar15 = puVar15 + __n;
            iVar12 = iVar12 + -1;
            puVar7 = puVar13;
            puVar13 = puVar14;
          } while (iVar12 != 0);
          puVar7 = puVar14 + -__n;
        }
        dec->alpha_prev_line_ = puVar7;
      }
      else {
        iVar4 = VP8LDecodeAlphaImageStream(pAVar8,num_rows + row);
        if (iVar4 == 0) goto LAB_00130493;
      }
      if (iVar6 <= num_rows + row) {
        dec->is_alpha_decoded_ = 1;
      }
      if (dec->is_alpha_decoded_ != 0) {
        ALPHDelete(dec->alph_dec_);
        dec->alph_dec_ = (ALPHDecoder *)0x0;
        if ((0 < dec->alpha_dithering_) &&
           (iVar6 = WebPDequantizeLevels
                              (dec->alpha_plane_ +
                               (long)io->crop_left + (long)(io->crop_top * stride),
                               io->crop_right - io->crop_left,io->crop_bottom - io->crop_top,stride,
                               dec->alpha_dithering_), iVar6 == 0)) goto LAB_00130493;
      }
    }
    puVar7 = dec->alpha_plane_ + stride * row;
  }
  return puVar7;
}

Assistant:

const uint8_t* VP8DecompressAlphaRows(VP8Decoder* const dec,
                                      const VP8Io* const io,
                                      int row, int num_rows) {
  const int width = io->width;
  const int height = io->crop_bottom;

  assert(dec != NULL && io != NULL);

  if (row < 0 || num_rows <= 0 || row + num_rows > height) {
    return NULL;
  }

  if (!dec->is_alpha_decoded_) {
    if (dec->alph_dec_ == NULL) {    // Initialize decoder.
      dec->alph_dec_ = ALPHNew();
      if (dec->alph_dec_ == NULL) return NULL;
      if (!AllocateAlphaPlane(dec, io)) goto Error;
      if (!ALPHInit(dec->alph_dec_, dec->alpha_data_, dec->alpha_data_size_,
                    io, dec->alpha_plane_)) {
        goto Error;
      }
      // if we allowed use of alpha dithering, check whether it's needed at all
      if (dec->alph_dec_->pre_processing_ != ALPHA_PREPROCESSED_LEVELS) {
        dec->alpha_dithering_ = 0;   // disable dithering
      } else {
        num_rows = height - row;     // decode everything in one pass
      }
    }

    assert(dec->alph_dec_ != NULL);
    assert(row + num_rows <= height);
    if (!ALPHDecode(dec, row, num_rows)) goto Error;

    if (dec->is_alpha_decoded_) {   // finished?
      ALPHDelete(dec->alph_dec_);
      dec->alph_dec_ = NULL;
      if (dec->alpha_dithering_ > 0) {
        uint8_t* const alpha = dec->alpha_plane_ + io->crop_top * width
                             + io->crop_left;
        if (!WebPDequantizeLevels(alpha,
                                  io->crop_right - io->crop_left,
                                  io->crop_bottom - io->crop_top,
                                  width, dec->alpha_dithering_)) {
          goto Error;
        }
      }
    }
  }

  // Return a pointer to the current decoded row.
  return dec->alpha_plane_ + row * width;

 Error:
  WebPDeallocateAlphaMemory(dec);
  return NULL;
}